

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O0

double GetMBSSIM(uint8_t *yuv1,uint8_t *yuv2)

{
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  double dVar1;
  double dVar2;
  double sum;
  int y;
  int x;
  double local_20;
  int local_18;
  int local_14;
  
  local_20 = 0.0;
  for (local_18 = 3; local_18 < 0xd; local_18 = local_18 + 1) {
    for (local_14 = 3; local_14 < 0xd; local_14 = local_14 + 1) {
      dVar1 = (*VP8SSIMGetClipped)(in_RDI,0x20,in_RSI,0x20,local_14,local_18,0x10,0x10);
      local_20 = dVar1 + local_20;
    }
  }
  for (local_14 = 1; local_14 < 7; local_14 = local_14 + 1) {
    for (local_18 = 1; local_18 < 7; local_18 = local_18 + 1) {
      dVar1 = (*VP8SSIMGetClipped)(in_RDI + 0x10,0x20,in_RSI + 0x10,0x20,local_14,local_18,8,8);
      dVar2 = (*VP8SSIMGetClipped)(in_RDI + 0x18,0x20,in_RSI + 0x18,0x20,local_14,local_18,8,8);
      local_20 = dVar2 + dVar1 + local_20;
    }
  }
  return local_20;
}

Assistant:

static double GetMBSSIM(const uint8_t* yuv1, const uint8_t* yuv2) {
  int x, y;
  double sum = 0.;

  // compute SSIM in a 10 x 10 window
  for (y = VP8_SSIM_KERNEL; y < 16 - VP8_SSIM_KERNEL; y++) {
    for (x = VP8_SSIM_KERNEL; x < 16 - VP8_SSIM_KERNEL; x++) {
      sum += VP8SSIMGetClipped(yuv1 + Y_OFF_ENC, BPS, yuv2 + Y_OFF_ENC, BPS,
                               x, y, 16, 16);
    }
  }
  for (x = 1; x < 7; x++) {
    for (y = 1; y < 7; y++) {
      sum += VP8SSIMGetClipped(yuv1 + U_OFF_ENC, BPS, yuv2 + U_OFF_ENC, BPS,
                               x, y, 8, 8);
      sum += VP8SSIMGetClipped(yuv1 + V_OFF_ENC, BPS, yuv2 + V_OFF_ENC, BPS,
                               x, y, 8, 8);
    }
  }
  return sum;
}